

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtestcase.cpp
# Opt level: O0

bool QTest::invokeTestMethodIfValid(QMetaMethod m,QObject *obj)

{
  bool bVar1;
  long in_FS_OFFSET;
  TestFailedException *anon_var_0;
  TestSkippedException *anon_var_0_1;
  bool ok;
  ConnectionType in_stack_ffffffffffffffac;
  QObject *in_stack_ffffffffffffffb0;
  QMetaMethod *in_stack_ffffffffffffffb8;
  IfNotOldStyleArgs<bool> local_19;
  QMetaMethod local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QMetaMethod::isValid(&local_18);
  if (bVar1) {
    local_19 = QMetaMethod::invoke<>
                         (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                          in_stack_ffffffffffffffac);
  }
  else {
    local_19 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_19;
  }
  __stack_chk_fail();
}

Assistant:

static bool invokeTestMethodIfValid(QMetaMethod m, QObject *obj = QTest::currentTestObject)
{
    if (!m.isValid())
        return false;
    bool ok = true;
    try { ok = m.invoke(obj, Qt ::DirectConnection); }
    catch (const TestFailedException &) {}  // ignore (used for control flow)
    catch (const TestSkippedException &) {} // ditto
    // every other exception is someone else's problem
    return ok;
}